

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

void ft_var_load_avar(TT_Face face)

{
  FT_Stream stream;
  FT_Memory pFVar1;
  GX_Blend pGVar2;
  FT_UShort FVar3;
  FT_Error FVar4;
  FT_ULong FVar5;
  FT_ULong new_count;
  GX_AVarSegment pGVar6;
  GX_AVarCorrespondence pGVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  FT_Error local_54;
  FT_ULong local_50;
  FT_ULong table_len;
  FT_ULong local_40;
  FT_Memory local_38;
  
  stream = (face->root).stream;
  pFVar1 = stream->memory;
  pGVar2 = face->blend;
  pGVar2->avar_loaded = '\x01';
  FVar4 = (*face->goto_table)(face,0x61766172,stream,&table_len);
  if (FVar4 != 0) {
    return;
  }
  local_54 = FT_Stream_EnterFrame(stream,table_len);
  if (local_54 != 0) {
    return;
  }
  FVar5 = FT_Stream_GetULong(stream);
  new_count = FT_Stream_GetULong(stream);
  if ((FVar5 == 0x10000) && (new_count == pGVar2->mmvar->num_axis)) {
    pGVar6 = (GX_AVarSegment)ft_mem_realloc(pFVar1,0x10,0,new_count,(void *)0x0,&local_54);
    pGVar2->avar_segment = pGVar6;
    if (local_54 == 0) {
      lVar8 = -8;
      local_40 = new_count;
      local_38 = pFVar1;
      for (local_50 = 0; pFVar1 = local_38, local_50 != local_40; local_50 = local_50 + 1) {
        FVar3 = FT_Stream_GetUShort(stream);
        pGVar6->pairCount = FVar3;
        FVar5 = local_50;
        if (table_len < (uint)FVar3 * 4) goto LAB_00168f48;
        pGVar7 = (GX_AVarCorrespondence)
                 ft_mem_realloc(pFVar1,0x10,0,(ulong)FVar3,(void *)0x0,&local_54);
        pGVar6->correspondence = pGVar7;
        FVar5 = local_50;
        if (local_54 != 0) goto LAB_00168f48;
        lVar9 = 0;
        for (uVar10 = 0; uVar10 < pGVar6->pairCount; uVar10 = uVar10 + 1) {
          FVar3 = FT_Stream_GetUShort(stream);
          *(long *)((long)&pGVar6->correspondence->fromCoord + lVar9) =
               (long)((int)(short)FVar3 << 2);
          FVar3 = FT_Stream_GetUShort(stream);
          *(long *)((long)&pGVar6->correspondence->toCoord + lVar9) = (long)((int)(short)FVar3 << 2)
          ;
          lVar9 = lVar9 + 0x10;
        }
        pGVar6 = pGVar6 + 1;
        lVar8 = lVar8 + 0x10;
      }
    }
  }
LAB_00168f80:
  FT_Stream_ExitFrame(stream);
  return;
LAB_00168f48:
  for (; 0 < (long)FVar5; FVar5 = FVar5 - 1) {
    ft_mem_free(pFVar1,*(void **)((long)&pGVar2->avar_segment->pairCount + lVar8));
    *(undefined8 *)((long)&pGVar2->avar_segment->pairCount + lVar8) = 0;
    lVar8 = lVar8 + -0x10;
  }
  ft_mem_free(pFVar1,pGVar2->avar_segment);
  pGVar2->avar_segment = (GX_AVarSegment)0x0;
  goto LAB_00168f80;
}

Assistant:

static void
  ft_var_load_avar( TT_Face  face )
  {
    FT_Stream       stream = FT_FACE_STREAM( face );
    FT_Memory       memory = stream->memory;
    GX_Blend        blend  = face->blend;
    GX_AVarSegment  segment;
    FT_Error        error = FT_Err_Ok;
    FT_Long         version;
    FT_Long         axisCount;
    FT_Int          i, j;
    FT_ULong        table_len;

    FT_UNUSED( error );


    FT_TRACE2(( "AVAR " ));

    blend->avar_loaded = TRUE;
    error = face->goto_table( face, TTAG_avar, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      return;
    }

    if ( FT_FRAME_ENTER( table_len ) )
      return;

    version   = FT_GET_LONG();
    axisCount = FT_GET_LONG();

    if ( version != 0x00010000L )
    {
      FT_TRACE2(( "bad table version\n" ));
      goto Exit;
    }

    FT_TRACE2(( "loaded\n" ));

    if ( axisCount != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_load_avar: number of axes in `avar' and `fvar'\n"
                  "                  table are different\n" ));
      goto Exit;
    }

    if ( FT_NEW_ARRAY( blend->avar_segment, axisCount ) )
      goto Exit;

    segment = &blend->avar_segment[0];
    for ( i = 0; i < axisCount; i++, segment++ )
    {
      FT_TRACE5(( "  axis %d:\n", i ));

      segment->pairCount = FT_GET_USHORT();
      if ( (FT_ULong)segment->pairCount * 4 > table_len                ||
           FT_NEW_ARRAY( segment->correspondence, segment->pairCount ) )
      {
        /* Failure.  Free everything we have done so far.  We must do */
        /* it right now since loading the `avar' table is optional.   */

        for ( j = i - 1; j >= 0; j-- )
          FT_FREE( blend->avar_segment[j].correspondence );

        FT_FREE( blend->avar_segment );
        blend->avar_segment = NULL;
        goto Exit;
      }

      for ( j = 0; j < segment->pairCount; j++ )
      {
        /* convert to Fixed */
        segment->correspondence[j].fromCoord = FT_GET_SHORT() * 4;
        segment->correspondence[j].toCoord   = FT_GET_SHORT() * 4;

        FT_TRACE5(( "    mapping %.5f to %.5f\n",
                    segment->correspondence[j].fromCoord / 65536.0,
                    segment->correspondence[j].toCoord / 65536.0 ));
      }

      FT_TRACE5(( "\n" ));
    }

  Exit:
    FT_FRAME_EXIT();
  }